

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Maybe<kj::AutoCloseFd> * __thiscall
kj::anon_unknown_8::DiskHandle::tryOpenSubdirInternal
          (Maybe<kj::AutoCloseFd> *__return_storage_ptr__,DiskHandle *this,PathPtr path)

{
  PathPtr path_00;
  bool bVar1;
  int code;
  AutoCloseFd *t;
  AutoCloseFd local_7c;
  AutoCloseFd result;
  Fault local_68;
  Fault f;
  undefined1 auStack_48 [4];
  int error;
  DiskHandle *local_40;
  PathPtr *local_38;
  int local_30;
  int local_2c;
  int _kjSyscallError;
  int newFd;
  DiskHandle *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  this_local = (DiskHandle *)path.parts.ptr;
  _auStack_48 = &local_2c;
  local_38 = (PathPtr *)&this_local;
  local_40 = this;
  __kjSyscallError = this;
  path_local.parts.size_ = (size_t)__return_storage_ptr__;
  code = _::Debug::
         syscallError<kj::(anonymous_namespace)::DiskHandle::tryOpenSubdirInternal(kj::PathPtr)const::_lambda()_1_>
                   ((anon_class_24_3_ffa5648e *)auStack_48,false);
  local_30 = code;
  if (code == 0) {
    AutoCloseFd::AutoCloseFd(&local_7c,local_2c);
    t = mv<kj::AutoCloseFd>(&local_7c);
    Maybe<kj::AutoCloseFd>::Maybe(__return_storage_ptr__,t);
    AutoCloseFd::~AutoCloseFd(&local_7c);
  }
  else if (code == 2) {
    Maybe<kj::AutoCloseFd>::Maybe(__return_storage_ptr__,(void *)0x0);
  }
  else {
    if (code == 0x14) {
      f.exception = (Exception *)this_local;
      path_00.parts.size_ = (size_t)path_local.parts.ptr;
      path_00.parts.ptr = (String *)this_local;
      bVar1 = exists(this,path_00);
      if (!bVar1) {
        Maybe<kj::AutoCloseFd>::Maybe(__return_storage_ptr__,(void *)0x0);
        return __return_storage_ptr__;
      }
    }
    _::Debug::Fault::Fault<int,kj::PathPtr&>
              (&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x303,code,"openat(fd, path, O_DIRECTORY)","path",(PathPtr *)&this_local);
    Maybe<kj::AutoCloseFd>::Maybe(__return_storage_ptr__,(void *)0x0);
    _::Debug::Fault::~Fault(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Maybe<AutoCloseFd> tryOpenSubdirInternal(PathPtr path) const {
    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(
        fd, path.toString().cStr(), O_RDONLY | MAYBE_O_CLOEXEC | MAYBE_O_DIRECTORY)) {
      case ENOENT:
        return nullptr;
      case ENOTDIR:
        // Could mean that a parent is not a directory, which we treat as "doesn't exist".
        // Could also mean that the specified file is not a directory, which should throw.
        // Check using exists().
        if (!exists(path)) {
          return nullptr;
        }
        // fallthrough
      default:
        KJ_FAIL_SYSCALL("openat(fd, path, O_DIRECTORY)", error, path) { return nullptr; }
    }

    kj::AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return kj::mv(result);
  }